

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXAnimation.cpp
# Opt level: O3

void __thiscall Assimp::FBX::AnimationCurve::~AnimationCurve(AnimationCurve *this)

{
  ~AnimationCurve(this);
  operator_delete(this);
  return;
}

Assistant:

AnimationCurve::~AnimationCurve()
{
    // empty
}